

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_cell_face(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  void *__ptr;
  long lVar10;
  REF_CELL *ppRVar11;
  bool bVar12;
  long lVar13;
  REF_FACE pRVar14;
  int iVar15;
  REF_STATUS ref_private_macro_code_rss;
  long lVar16;
  uint local_80;
  uint local_7c;
  REF_INT nodes [4];
  REF_FACE ref_face;
  void *local_50;
  REF_CELL *local_48;
  long local_40;
  REF_NODE local_38;
  
  pRVar3 = ref_grid->node;
  uVar8 = ref_face_create(&ref_face,ref_grid);
  pRVar14 = ref_face;
  if (uVar8 == 0) {
    local_38 = pRVar3;
    if ((long)ref_face->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x122,"ref_validation_cell_face","malloc hits of REF_INT negative");
      uVar8 = 1;
    }
    else {
      __ptr = malloc((long)ref_face->n << 2);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x122,"ref_validation_cell_face","malloc hits of REF_INT NULL");
        uVar8 = 2;
      }
      else {
        local_7c = 0;
        if (0 < pRVar14->n) {
          lVar10 = 0;
          do {
            *(undefined4 *)((long)__ptr + lVar10 * 4) = 0;
            lVar10 = lVar10 + 1;
            local_7c = (uint)lVar10;
          } while (lVar10 < pRVar14->n);
        }
        local_48 = ref_grid->cell;
        ppRVar11 = ref_grid->cell + 8;
        lVar10 = 8;
        local_50 = __ptr;
        do {
          pRVar4 = *ppRVar11;
          local_40 = lVar10;
          if (0 < pRVar4->max) {
            iVar15 = 0;
            do {
              if ((pRVar4->c2n[(long)pRVar4->size_per * (long)iVar15] != -1) &&
                 (0 < pRVar4->face_per)) {
                lVar16 = 0;
                lVar10 = 0;
                do {
                  pRVar5 = pRVar4->c2n;
                  pRVar6 = pRVar4->f2n;
                  lVar13 = 0;
                  do {
                    nodes[lVar13] =
                         pRVar5[(long)pRVar4->size_per * (long)iVar15 +
                                (long)*(int *)((long)pRVar6 + lVar13 * 4 + lVar16)];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 4);
                  uVar8 = ref_face_with(ref_face,nodes,(REF_INT *)&local_7c);
                  if (uVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                           ,300,"ref_validation_cell_face",(ulong)uVar8,"find cell face");
                    return uVar8;
                  }
                  piVar1 = (int *)((long)local_50 + (long)(int)local_7c * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar10 = lVar10 + 1;
                  lVar16 = lVar16 + 0x10;
                  __ptr = local_50;
                } while (lVar10 < pRVar4->face_per);
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 < pRVar4->max);
          }
          ppRVar11 = local_48 + local_40 + 1;
          lVar10 = local_40 + 1;
        } while (lVar10 != 0x10);
        pRVar4 = ref_grid->cell[3];
        if (0 < pRVar4->max) {
          iVar15 = 0;
          do {
            pRVar5 = pRVar4->c2n;
            if (pRVar5[(long)pRVar4->size_per * (long)iVar15] != -1) {
              lVar10 = 0;
              do {
                nodes[lVar10] = pRVar5[(long)pRVar4->size_per * (long)iVar15 + lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              nodes[3] = nodes[0];
              uVar8 = ref_face_with(ref_face,nodes,(REF_INT *)&local_7c);
              if (uVar8 != 0) {
                ref_node_location(ref_grid->node,nodes[0]);
                ref_node_location(ref_grid->node,nodes[1]);
                ref_node_location(ref_grid->node,nodes[2]);
                ref_node_location(ref_grid->node,nodes[3]);
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x13f,"ref_validation_cell_face",(ulong)uVar8,"find tri");
                return uVar8;
              }
              piVar1 = (int *)((long)local_50 + (long)(int)local_7c * 4);
              *piVar1 = *piVar1 + 1;
              __ptr = local_50;
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < pRVar4->max);
        }
        pRVar4 = ref_grid->cell[6];
        if (0 < pRVar4->max) {
          iVar15 = 0;
          do {
            pRVar5 = pRVar4->c2n;
            if (pRVar5[(long)pRVar4->size_per * (long)iVar15] != -1) {
              lVar10 = 0;
              do {
                nodes[lVar10] = pRVar5[(long)pRVar4->size_per * (long)iVar15 + lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              uVar8 = ref_face_with(ref_face,nodes,(REF_INT *)&local_7c);
              if (uVar8 != 0) {
                ref_node_location(ref_grid->node,nodes[0]);
                ref_node_location(ref_grid->node,nodes[1]);
                ref_node_location(ref_grid->node,nodes[2]);
                ref_node_location(ref_grid->node,nodes[3]);
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x14f,"ref_validation_cell_face",(ulong)uVar8,"find qua");
                return uVar8;
              }
              piVar1 = (int *)((long)local_50 + (long)(int)local_7c * 4);
              *piVar1 = *piVar1 + 1;
              __ptr = local_50;
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < pRVar4->max);
        }
        local_7c = 0;
        if (ref_face->n < 1) {
          uVar8 = 0;
          pRVar14 = ref_face;
        }
        else {
          bVar7 = 0;
          local_80 = 0;
          do {
            iVar15 = *(int *)((long)__ptr + (long)(int)local_7c * 4);
            if (ref_grid->mpi->n < 2) {
              bVar12 = iVar15 != 2;
LAB_0016e6a1:
              if (bVar12) goto LAB_0016e6a9;
            }
            else {
              pRVar5 = local_38->part;
              iVar2 = local_38->ref_mpi->id;
              pRVar6 = ref_face->f2n;
              uVar8 = local_7c << 2;
              if (((iVar2 != pRVar5[pRVar6[(int)uVar8]]) &&
                  (iVar2 != pRVar5[pRVar6[(int)(uVar8 | 1)]])) &&
                 (iVar2 != pRVar5[pRVar6[(int)(uVar8 | 2)]])) {
                bVar12 = iVar2 == pRVar5[pRVar6[(int)(uVar8 | 3)]] || 2 < iVar15;
                if ((iVar2 == pRVar5[pRVar6[(int)(uVar8 | 3)]]) && (iVar15 < 3)) goto LAB_0016e693;
                goto LAB_0016e6a1;
              }
              if (iVar15 < 3) {
LAB_0016e693:
                bVar12 = iVar15 < 2;
                goto LAB_0016e6a1;
              }
LAB_0016e6a9:
              printf(" hits %d\n",(ulong)*(uint *)((long)__ptr + (long)(int)local_7c * 4));
              pRVar5 = ref_face->f2n;
              lVar10 = 0;
              do {
                nodes[lVar10] = pRVar5[(long)(int)local_7c * 4 + lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n",(ulong)local_7c);
              uVar8 = ref_node_location(ref_grid->node,nodes[0]);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x16d,"ref_validation_cell_face",(ulong)uVar8,"n0");
                return uVar8;
              }
              uVar8 = ref_node_location(ref_grid->node,nodes[1]);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x16e,"ref_validation_cell_face",(ulong)uVar8,"n1");
                return uVar8;
              }
              uVar8 = ref_node_location(ref_grid->node,nodes[2]);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x16f,"ref_validation_cell_face",(ulong)uVar8,"n2");
                return uVar8;
              }
              uVar8 = ref_node_location(ref_grid->node,nodes[3]);
              if (uVar8 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x170,"ref_validation_cell_face",(ulong)uVar8,"n3");
                local_80 = uVar8;
              }
              bVar7 = 1;
              __ptr = local_50;
              if (uVar8 != 0) {
                return local_80;
              }
            }
            local_7c = local_7c + 1;
          } while ((int)local_7c < ref_face->n);
          uVar8 = (uint)bVar7;
          pRVar14 = ref_face;
        }
        free(__ptr);
        uVar9 = ref_face_free(pRVar14);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x176,"ref_validation_cell_face",(ulong)uVar9,"face free");
          uVar8 = uVar9;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           0x120,"ref_validation_cell_face",(ulong)uVar8,"face");
  }
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL problem, report;
  REF_STATUS code;

  problem = REF_FALSE;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      problem = REF_TRUE;
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return (problem ? REF_FAILURE : REF_SUCCESS);
}